

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

int __thiscall Sudoku::kolikBitu(Sudoku *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = (this->s).sloupce[x] | (this->s).radky[y] | (this->s).ctverce[x / 3][y / 3];
  if (uVar3 != 0) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uVar3 & 1);
      bVar1 = 1 < uVar3;
      uVar3 = uVar3 >> 1;
    } while (bVar1);
    return iVar2;
  }
  return 0;
}

Assistant:

int Sudoku::kolikBitu (int x, int y)
{
  // sjednoceni mnozin - zjistime co je zakazano pouzit na nasi pozci
  unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3];
  // akumulator
  unsigned int akum;
  // provadime bitovy posun doprava dokud neni zakazano = 0
  for (akum = 0; zakazano; zakazano >>= 1)
  {
    // kdyz je na nejnizsim bitu 1, zvysime akumulator
    akum += zakazano & 1;
  }
  return akum; // vratime kolik bitu je nastaveno
}